

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase1::Run(BasicAtomicCase1 *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  char *format;
  GLuint i;
  ulong uVar4;
  long lVar5;
  int data [4];
  string local_d8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInVS((ShaderStorageBufferObjectBase *)this,2);
  lVar5 = 0x10;
  if ((bVar2) &&
     (bVar2 = ShaderStorageBufferObjectBase::SupportedInGS((ShaderStorageBufferObjectBase *)this,2),
     bVar2)) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) coherent buffer VSuint {\n  uint g_uint_out[4];\n};\nlayout(std430, binding = 1) coherent buffer VSint {\n  int data[4];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = g_in_position;\n\n  if (atomicExchange(g_uint_out[gl_VertexID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_out[gl_VertexID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_out[gl_VertexID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_out[gl_VertexID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_out[gl_VertexID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_out[gl_VertexID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_out[gl_VertexID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_out.data[gl_VertexID], 1) != 0) return;\n  if (atomicAdd(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicMin(g_int_out.data[gl_VertexID], 1) != 3) return;\n  if (atomicMax(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicAnd(g_int_out.data[gl_VertexID], 0x1) != 2) return;\n  if (atomicOr(g_int_out.data[gl_VertexID], 0x3) != 0) return;\n  if (atomicXor(g_int_out.data[gl_VertexID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_out.data[gl_VertexID], 0x2, 0x7) != 2) {\n    g_int_out.data[gl_VertexID] = 1;\n    return;\n  }\n}"
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1b32ab9);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,0x1b32ab9);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 2) coherent buffer GSuint {\n  uint data[4];\n} g_uint_gs;\nlayout(std430, binding = 3) coherent buffer GSint {\n  int data[4];\n} g_int_gs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n\n  if (atomicExchange(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_gs.data[gl_PrimitiveIDIn] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_gs.data[gl_PrimitiveIDIn], 1) != 0) return;\n  if (atomicAdd(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicMin(g_int_gs.data[gl_PrimitiveIDIn], 1) != 3) return;\n  if (atomicMax(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicAnd(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 2) return;\n  if (atomicOr(g_int_gs.data[gl_PrimitiveIDIn], 0x3) != 0) return;\n  if (atomicXor(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_gs.data[gl_PrimitiveIDIn], 0x2, 0x7) != 2) {\n    g_int_gs.data[gl_PrimitiveIDIn] = 1;\n    return;\n  }\n}"
               ,"");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 4) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 5) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n\n  if (atomicExchange(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_PrimitiveID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_fs.data[gl_PrimitiveID], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_PrimitiveID], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_PrimitiveID], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_PrimitiveID], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_PrimitiveID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_PrimitiveID], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_PrimitiveID] = 1;\n    return;\n  }\n}"
               ,"");
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      ((ShaderStorageBufferObjectBase *)this,&local_d8,&local_50,&local_70,&local_90
                       ,&local_b0);
    *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram
              (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      ((ShaderStorageBufferObjectBase *)this,
                       *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    lVar5 = -1;
    if (bVar2) {
      buffers = (GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4);
      glu::CallLogWrapper::glGenBuffers(this_00,6,buffers);
      lVar5 = 0;
      do {
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,(GLuint)lVar5,buffers[lVar5]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_d8,0x88e8);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      local_d8.field_2._M_allocated_capacity = 0x3f4ccccdbf4ccccd;
      local_d8.field_2._8_8_ = 0x3f4ccccd3f4ccccd;
      local_d8._M_dataplus._M_p = (pointer)0xbf4ccccdbf4ccccd;
      local_d8._M_string_length = 0xbf4ccccd3f4ccccd;
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_program);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_program);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&local_d8,0x88e4);
      uVar4 = 0;
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glGenVertexArrays
                (this_00,1,(GLuint *)((this->super_ComputeShaderBase).g_color_eps.m_data + 3));
      glu::CallLogWrapper::glBindVertexArray
                (this_00,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[3]);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_program);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram
                (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      glu::CallLogWrapper::glBindVertexArray
                (this_00,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[3]);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      bVar2 = true;
      do {
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,buffers[uVar4 * 2]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_d8);
        lVar5 = 0;
        do {
          uVar1 = *(uint *)((long)&local_d8._M_dataplus._M_p + lVar5 * 4);
          if (uVar1 != 7) {
            format = "uData at index %d is %d should be %d.\n";
            goto LAB_00963c47;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x90d2,
                   (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[uVar4 * 2 + -2]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_d8);
        lVar5 = 0;
        do {
          uVar1 = *(uint *)((long)&local_d8._M_dataplus._M_p + lVar5 * 4);
          if (uVar1 != 7) {
            format = "iData at index %d is %d should be %d.\n";
LAB_00963c47:
            anon_unknown_0::Output(format,lVar5,(ulong)uVar1,7);
            goto LAB_00963c53;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        bVar2 = uVar4 < 2;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 3);
LAB_00963c53:
      return -(ulong)bVar2;
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		if (!SupportedInGS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_in_position;" NL
			   "layout(std430, binding = 0) coherent buffer VSuint {" NL "  uint g_uint_out[4];" NL "};" NL
			   "layout(std430, binding = 1) coherent buffer VSint {" NL "  int data[4];" NL "} g_int_out;" NL
			   "uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			   "  gl_Position = g_in_position;" NL NL
			   "  if (atomicExchange(g_uint_out[gl_VertexID], g_uint_value[1]) != 0u) return;" NL
			   "  if (atomicAdd(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicMin(g_uint_out[gl_VertexID], g_uint_value[1]) != 3u) return;" NL
			   "  if (atomicMax(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicAnd(g_uint_out[gl_VertexID], g_uint_value[3]) != 2u) return;" NL
			   "  if (atomicOr(g_uint_out[gl_VertexID], g_uint_value[4]) != 0u) return;" NL
			   "  if (g_uint_value[0] > 0u) {" NL
			   "    if (atomicXor(g_uint_out[gl_VertexID], g_uint_value[5]) != 3u) return;" NL "  }" NL
			   "  if (atomicCompSwap(g_uint_out[gl_VertexID], g_uint_value[6], g_uint_value[7]) != 2u) {" NL
			   "    g_uint_out[gl_VertexID] = 1u;" NL "    return;" NL "  }" NL NL
			   "  if (atomicExchange(g_int_out.data[gl_VertexID], 1) != 0) return;" NL
			   "  if (atomicAdd(g_int_out.data[gl_VertexID], 2) != 1) return;" NL
			   "  if (atomicMin(g_int_out.data[gl_VertexID], 1) != 3) return;" NL
			   "  if (atomicMax(g_int_out.data[gl_VertexID], 2) != 1) return;" NL
			   "  if (atomicAnd(g_int_out.data[gl_VertexID], 0x1) != 2) return;" NL
			   "  if (atomicOr(g_int_out.data[gl_VertexID], 0x3) != 0) return;" NL
			   "  if (atomicXor(g_int_out.data[gl_VertexID], 0x1) != 3) return;" NL
			   "  if (atomicCompSwap(g_int_out.data[gl_VertexID], 0x2, 0x7) != 2) {" NL
			   "    g_int_out.data[gl_VertexID] = 1;" NL "    return;" NL "  }" NL "}";

		const char* const glsl_gs = NL
			"layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL
			"layout(std430, binding = 2) coherent buffer GSuint {" NL "  uint data[4];" NL "} g_uint_gs;" NL
			"layout(std430, binding = 3) coherent buffer GSint {" NL "  int data[4];" NL "} g_int_gs;" NL
			"uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			"  gl_Position = gl_in[0].gl_Position;" NL "  gl_PrimitiveID = gl_PrimitiveIDIn;" NL "  EmitVertex();" NL NL
			"  if (atomicExchange(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 0u) return;" NL
			"  if (atomicAdd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;" NL
			"  if (atomicMin(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 3u) return;" NL
			"  if (atomicMax(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;" NL
			"  if (atomicAnd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[3]) != 2u) return;" NL
			"  if (atomicOr(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[4]) != 0u) return;" NL
			"  if (g_uint_value[0] > 0u) {" NL
			"    if (atomicXor(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[5]) != 3u) return;" NL "  }" NL
			"  if (atomicCompSwap(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[6], g_uint_value[7]) != 2u) {" NL
			"    g_uint_gs.data[gl_PrimitiveIDIn] = 1u;" NL "    return;" NL "  }" NL NL
			"  if (atomicExchange(g_int_gs.data[gl_PrimitiveIDIn], 1) != 0) return;" NL
			"  if (atomicAdd(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;" NL
			"  if (atomicMin(g_int_gs.data[gl_PrimitiveIDIn], 1) != 3) return;" NL
			"  if (atomicMax(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;" NL
			"  if (atomicAnd(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 2) return;" NL
			"  if (atomicOr(g_int_gs.data[gl_PrimitiveIDIn], 0x3) != 0) return;" NL
			"  if (atomicXor(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 3) return;" NL
			"  if (atomicCompSwap(g_int_gs.data[gl_PrimitiveIDIn], 0x2, 0x7) != 2) {" NL
			"    g_int_gs.data[gl_PrimitiveIDIn] = 1;" NL "    return;" NL "  }" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "layout(std430, binding = 4) coherent buffer FSuint {" NL
			   "  uint data[4];" NL "} g_uint_fs;" NL "layout(std430, binding = 5) coherent buffer FSint {" NL
			   "  int data[4];" NL "} g_int_fs;" NL
			   "uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			   "  g_fs_out = vec4(0, 1, 0, 1);" NL NL
			   "  if (atomicExchange(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;" NL
			   "  if (atomicAdd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicMin(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;" NL
			   "  if (atomicMax(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicAnd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;" NL
			   "  if (atomicOr(g_uint_fs.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;" NL
			   "  if (g_uint_value[0] > 0u) {" NL
			   "    if (atomicXor(g_uint_fs.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;" NL "  }" NL
			   "  if (atomicCompSwap(g_uint_fs.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {" NL
			   "    g_uint_fs.data[gl_PrimitiveID] = 1u;" NL "    return;" NL "  }" NL NL
			   "  if (atomicExchange(g_int_fs.data[gl_PrimitiveID], 1) != 0) return;" NL
			   "  if (atomicAdd(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;" NL
			   "  if (atomicMin(g_int_fs.data[gl_PrimitiveID], 1) != 3) return;" NL
			   "  if (atomicMax(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;" NL
			   "  if (atomicAnd(g_int_fs.data[gl_PrimitiveID], 0x1) != 2) return;" NL
			   "  if (atomicOr(g_int_fs.data[gl_PrimitiveID], 0x3) != 0) return;" NL
			   "  if (atomicXor(g_int_fs.data[gl_PrimitiveID], 0x1) != 3) return;" NL
			   "  if (atomicCompSwap(g_int_fs.data[gl_PrimitiveID], 0x2, 0x7) != 2) {" NL
			   "    g_int_fs.data[gl_PrimitiveID] = 1;" NL "    return;" NL "  }" NL "}";
		m_program = CreateProgram(glsl_vs, "", "", glsl_gs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(6, m_storage_buffer);
		for (GLuint i = 0; i < 6; ++i)
		{
			const int data[4] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		/* vertex buffer */
		{
			const float data[] = { -0.8f, -0.8f, 0.8f, -0.8f, -0.8f, 0.8f, 0.8f, 0.8f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		for (int ii = 0; ii < 3; ++ii)
		{
			/* uint data */
			{
				GLuint data[4];
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[ii * 2 + 0]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
				for (GLuint i = 0; i < 4; ++i)
				{
					if (data[i] != 7)
					{
						Output("uData at index %d is %d should be %d.\n", i, data[i], 7);
						return ERROR;
					}
				}
			}
			/* int data */
			{
				GLint data[4];
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[ii * 2 + 1]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
				for (GLint i = 0; i < 4; ++i)
				{
					if (data[i] != 7)
					{
						Output("iData at index %d is %d should be %d.\n", i, data[i], 7);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}